

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

char * readstr(FILE *file)

{
  int iVar1;
  char *pcStack_30;
  int byte;
  char *str;
  size_t index;
  size_t capacity;
  FILE *file_local;
  
  index = 0x10;
  str = (char *)0xffffffffffffffff;
  pcStack_30 = (char *)0x0;
  while( true ) {
    str = str + 1;
    if ((index <= str) || (pcStack_30 == (char *)0x0)) {
      index = index << 1;
      pcStack_30 = (char *)realloc(pcStack_30,index);
      if (pcStack_30 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    iVar1 = getc((FILE *)file);
    if (iVar1 == -1) break;
    pcStack_30[(long)str] = (char)iVar1;
    if (pcStack_30[(long)str] == '\0') {
      return pcStack_30;
    }
  }
  free(pcStack_30);
  return (char *)0x0;
}

Assistant:

static char *readstr(FILE *file)
{
	// Default buffer size, have it close to the average string length
	size_t capacity = 32 / 2;
	size_t index = -1;
	// Force the first iteration to allocate
	char *str = NULL;

	do {
		// Prepare going to next char
		index++;

		// If the buffer isn't suitable to write the next char...
		if (index >= capacity || !str) {
			capacity *= 2;
			str = (char *)realloc(str, capacity);
			// End now in case of error
			if (!str)
				return NULL;
		}

		// Read char
		int byte = getc(file);

		if (byte == EOF) {
			free(str);
			return NULL;
		}
		str[index] = byte;
	} while (str[index]);
	return str;
}